

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O2

ze_result_t __thiscall
tracing_layer::APITracerContextImp::enableTracingImp
          (APITracerContextImp *this,APITracerImp *tracerImp,ze_bool_t enable)

{
  tracingState_t tVar1;
  size_t sVar2;
  ostream *poVar3;
  ze_result_t zVar4;
  APITracerImp *local_30;
  
  local_30 = tracerImp;
  std::mutex::lock(&this->traceTableMutex);
  tVar1 = tracerImp->tracingState;
  if (tVar1 == disabledWaitingState) {
    zVar4 = ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
  }
  else if (tVar1 == enabledState) {
    zVar4 = ZE_RESULT_SUCCESS;
    if (enable == '\0') {
      std::__cxx11::
      list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::remove
                (&this->enabledTracerImpList,(char *)&local_30);
      local_30->tracingState = disabledWaitingState;
      sVar2 = updateTracerArrays(this);
      if (sVar2 == 0) {
        local_30->tracingState = disabledState;
      }
    }
  }
  else {
    if (tVar1 != disabledState) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Abort was called at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x199);
      poVar3 = std::operator<<(poVar3," line in file: ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/source/layers/tracing/tracing_imp.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      abort();
    }
    zVar4 = ZE_RESULT_SUCCESS;
    if (enable != '\0') {
      std::__cxx11::
      list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::push_back
                (&this->enabledTracerImpList,&local_30);
      local_30->tracingState = enabledState;
      updateTracerArrays(this);
      zVar4 = ZE_RESULT_SUCCESS;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->traceTableMutex);
  return zVar4;
}

Assistant:

ze_result_t
APITracerContextImp::enableTracingImp(struct APITracerImp *tracerImp,
                                      ze_bool_t enable) {
    std::lock_guard<std::mutex> lock(traceTableMutex);
    ze_result_t result;
    switch (tracerImp->tracingState) {
    case disabledState:
        if (enable) {
            enabledTracerImpList.push_back(tracerImp);
            tracerImp->tracingState = enabledState;
            updateTracerArrays();
        }
        result = ZE_RESULT_SUCCESS;
        break;

    case enabledState:
        if (!enable) {
            enabledTracerImpList.remove(tracerImp);
            tracerImp->tracingState = disabledWaitingState;
            if (updateTracerArrays() == 0)
                tracerImp->tracingState = disabledState;
        }
        result = ZE_RESULT_SUCCESS;
        break;

    case disabledWaitingState:
        result = ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
        break;

    default:
        result = ZE_RESULT_ERROR_UNINITIALIZED;
        UNRECOVERABLE_IF(true);
        break;
    }
    return result;
}